

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O3

int32_t __thiscall kaitai::kstream::read_s4le(kstream *this)

{
  int32_t t;
  int32_t local_c;
  
  std::istream::read((char *)this->m_io,(long)&local_c);
  return local_c;
}

Assistant:

int32_t kaitai::kstream::read_s4le() {
    int32_t t;
    m_io->read(reinterpret_cast<char *>(&t), 4);
#if __BYTE_ORDER == __BIG_ENDIAN
    t = bswap_32(t);
#endif
    return t;
}